

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMemCheckHandler.cxx
# Opt level: O0

void __thiscall
cmBoundsCheckerParser::StartElement(cmBoundsCheckerParser *this,string *name,char **atts)

{
  bool bVar1;
  ostream *poVar2;
  string local_1d0 [32];
  int local_1b0;
  int i;
  undefined1 local_1a0 [8];
  ostringstream ostr;
  value_type_conflict2 local_24;
  char **local_20;
  char **atts_local;
  string *name_local;
  cmBoundsCheckerParser *this_local;
  
  local_20 = atts;
  atts_local = (char **)name;
  name_local = (string *)this;
  bVar1 = std::operator==(name,"MemoryLeak");
  if ((bVar1) ||
     (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              atts_local,"ResourceLeak"), bVar1)) {
    local_24 = 0xe;
    std::vector<int,_std::allocator<int>_>::push_back(&this->Errors,&local_24);
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            atts_local,"Error");
    if ((bVar1) ||
       (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )atts_local,"Dangling Pointer"), bVar1)) {
      ParseError(this,local_20);
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  poVar2 = std::operator<<((ostream *)local_1a0,(string *)atts_local);
  std::operator<<(poVar2,":\n");
  for (local_1b0 = 0; local_20[local_1b0] != (char *)0x0; local_1b0 = local_1b0 + 2) {
    poVar2 = std::operator<<((ostream *)local_1a0,"   ");
    poVar2 = std::operator<<(poVar2,local_20[local_1b0]);
    poVar2 = std::operator<<(poVar2," - ");
    poVar2 = std::operator<<(poVar2,local_20[(long)local_1b0 + 1]);
    std::operator<<(poVar2,"\n");
  }
  std::operator<<((ostream *)local_1a0,"\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator+=((string *)&this->Log,local_1d0);
  std::__cxx11::string::~string(local_1d0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  return;
}

Assistant:

void StartElement(const std::string& name, const char** atts) override
  {
    if (name == "MemoryLeak" || name == "ResourceLeak") {
      this->Errors.push_back(cmCTestMemCheckHandler::MLK);
    } else if (name == "Error" || name == "Dangling Pointer") {
      this->ParseError(atts);
    }
    // Create the log
    std::ostringstream ostr;
    ostr << name << ":\n";
    int i = 0;
    for (; atts[i] != nullptr; i += 2) {
      ostr << "   " << atts[i] << " - " << atts[i + 1] << "\n";
    }
    ostr << "\n";
    this->Log += ostr.str();
  }